

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

bool deqp::gls::BufferTestUtil::compareByteArrays
               (TestLog *log,deUint8 *resPtr,deUint8 *refPtr,int numBytes)

{
  ostringstream *poVar1;
  undefined4 in_register_0000000c;
  size_t __n;
  ulong uVar2;
  int iVar3;
  void *__buf;
  int iVar4;
  ulong uVar5;
  int iVar6;
  undefined8 unaff_RBP;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  allocator<char> local_212;
  allocator<char> local_211;
  deUint8 *local_210;
  uint local_208;
  int local_204;
  deUint8 *local_200;
  ulong local_1f8;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  __n = CONCAT44(in_register_0000000c,numBytes);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Verify",&local_211);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Verification result",&local_212);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1d0,&local_1f0);
  tcu::LogSection::write((LogSection *)local_1b0,(int)log,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)local_1b0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  uVar9 = 0;
  uVar2 = (ulong)(uint)numBytes;
  if (numBytes < 1) {
    uVar2 = uVar9;
  }
  uVar7 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  uVar5 = 0xffffffffffffffff;
  iVar3 = 0;
  local_210 = refPtr;
  local_200 = resPtr;
  local_1f8 = uVar2;
  while( true ) {
    iVar4 = (int)uVar5;
    uVar10 = uVar5 & 0xffffffff;
    local_1b0._0_8_ = log;
    if (uVar2 == uVar9) break;
    if (resPtr[uVar9] == refPtr[uVar9]) {
      if (-1 < iVar4) {
        local_204 = iVar3;
        if (iVar3 < 4) {
          local_208 = (uint)uVar7;
          iVar6 = (int)uVar9 - iVar4;
          iVar3 = 8;
          if (iVar6 < 8) {
            iVar3 = iVar6;
          }
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::ostream::operator<<(poVar1,iVar6);
          std::operator<<((ostream *)poVar1," byte difference at offset ");
          std::ostream::operator<<(poVar1,iVar4);
          std::operator<<((ostream *)poVar1,"\n");
          std::operator<<((ostream *)poVar1,"  expected ");
          local_1d0._M_dataplus._M_p = (pointer)(local_210 + uVar10);
          local_1d0._M_string_length = (size_type)((deUint8 *)local_1d0._M_dataplus._M_p + iVar3);
          tcu::Format::operator<<
                    ((ostream *)poVar1,
                     (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                     &local_1d0);
          std::operator<<((ostream *)poVar1,"\n");
          std::operator<<((ostream *)poVar1,"  got ");
          resPtr = local_200;
          local_1f0._M_dataplus._M_p = (pointer)(local_200 + uVar10);
          local_1f0._M_string_length = (size_type)((deUint8 *)local_1f0._M_dataplus._M_p + iVar3);
          tcu::Format::operator<<
                    ((ostream *)poVar1,
                     (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                     &local_1f0);
          uVar7 = (ulong)local_208;
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          refPtr = local_210;
        }
        else {
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"(output too long, truncated)");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
        }
        iVar3 = local_204 + 1;
        uVar5 = 0xffffffffffffffff;
        uVar2 = local_1f8;
      }
    }
    else {
      if (iVar4 < 0) {
        uVar5 = uVar9;
      }
      uVar5 = uVar5 & 0xffffffff;
      uVar7 = 0;
    }
    uVar9 = uVar9 + 1;
  }
  if (-1 < iVar4) {
    if (iVar3 < 4) {
      iVar6 = (int)uVar2 - iVar4;
      iVar3 = 8;
      if (iVar6 < 8) {
        iVar3 = iVar6;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::operator<<(poVar1,iVar6);
      std::operator<<((ostream *)poVar1," byte difference at offset ");
      std::ostream::operator<<(poVar1,iVar4);
      std::operator<<((ostream *)poVar1,"\n");
      std::operator<<((ostream *)poVar1,"  expected ");
      local_1d0._M_dataplus._M_p = (pointer)(local_210 + uVar10);
      local_1d0._M_string_length = (size_type)((deUint8 *)local_1d0._M_dataplus._M_p + iVar3);
      tcu::Format::operator<<
                ((ostream *)poVar1,
                 (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                 &local_1d0);
      std::operator<<((ostream *)poVar1,"\n");
      std::operator<<((ostream *)poVar1,"  got ");
      local_1f0._M_dataplus._M_p = (pointer)(resPtr + uVar10);
      local_1f0._M_string_length = (size_type)((deUint8 *)local_1f0._M_dataplus._M_p + iVar3);
      tcu::Format::operator<<
                ((ostream *)poVar1,
                 (Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *)
                 &local_1f0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"(output too long, truncated)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  pcVar8 = "Verification FAILED!";
  if ((uVar7 & 1) != 0) {
    pcVar8 = "Verification passed.";
  }
  std::operator<<((ostream *)poVar1,pcVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TestLog::endSection(log);
  return (bool)((byte)uVar7 & 1);
}

Assistant:

bool compareByteArrays (tcu::TestLog& log, const deUint8* resPtr, const deUint8* refPtr, int numBytes)
{
	bool			isOk			= true;
	const int		maxSpanLen		= 8;
	const int		maxDiffSpans	= 4;
	int				numDiffSpans	= 0;
	int				diffSpanStart	= -1;
	int				ndx				= 0;

	log << TestLog::Section("Verify", "Verification result");

	for (;ndx < numBytes; ndx++)
	{
		if (resPtr[ndx] != refPtr[ndx])
		{
			if (diffSpanStart < 0)
				diffSpanStart = ndx;

			isOk = false;
		}
		else if (diffSpanStart >= 0)
		{
			if (numDiffSpans < maxDiffSpans)
			{
				int len			= ndx-diffSpanStart;
				int	printLen	= de::min(len, maxSpanLen);

				log << TestLog::Message << len << " byte difference at offset " << diffSpanStart << "\n"
										<< "  expected "	<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart+printLen)) << "\n"
										<< "  got "			<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart+printLen))
					<< TestLog::EndMessage;
			}
			else
				log << TestLog::Message << "(output too long, truncated)" << TestLog::EndMessage;

			numDiffSpans	+= 1;
			diffSpanStart	 = -1;
		}
	}

	if (diffSpanStart >= 0)
	{
		if (numDiffSpans < maxDiffSpans)
		{
				int len			= ndx-diffSpanStart;
				int	printLen	= de::min(len, maxSpanLen);

				log << TestLog::Message << len << " byte difference at offset " << diffSpanStart << "\n"
										<< "  expected "	<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(refPtr+diffSpanStart+printLen)) << "\n"
										<< "  got "			<< tcu::formatArray(tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart), tcu::Format::HexIterator<deUint8>(resPtr+diffSpanStart+printLen))
					<< TestLog::EndMessage;
		}
		else
			log << TestLog::Message << "(output too long, truncated)" << TestLog::EndMessage;
	}

	log << TestLog::Message << (isOk ? "Verification passed." : "Verification FAILED!") << TestLog::EndMessage;
	log << TestLog::EndSection;

	return isOk;
}